

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

NewOrderSingle * __thiscall
Application::queryNewOrderSingle50(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *this_00;
  FieldBase *pFVar2;
  OrdType ordType;
  FieldBase local_1d0;
  FieldBase local_178;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  this_00 = this;
  FIX::OrdType::OrdType((OrdType *)&local_178);
  queryClOrdID((ClOrdID *)&local_1d0,this_00);
  querySide((Side *)&local_120,this_00);
  FIX::TransactTime::TransactTime((TransactTime *)&local_70);
  queryOrdType((OrdType *)&local_c8,this_00);
  FIX::FieldBase::operator=(&local_178,&local_c8);
  FIX50::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)&local_1d0,(Side *)&local_120,
             (TransactTime *)&local_70,(OrdType *)&local_178);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_1d0);
  local_120._vptr_FieldBase._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_1d0,(CHAR *)&local_120);
  pFVar2 = &local_1d0;
  FIX50::NewOrderSingle::set(__return_storage_ptr__,(HandlInst *)pFVar2);
  FIX::FieldBase::~FieldBase(&local_1d0);
  querySymbol((Symbol *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX50::NewOrderSingle::set(__return_storage_ptr__,(Symbol *)pFVar2);
  FIX::FieldBase::~FieldBase(&local_1d0);
  queryOrderQty((OrderQty *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX50::NewOrderSingle::set(__return_storage_ptr__,(OrderQty *)pFVar2);
  FIX::FieldBase::~FieldBase(&local_1d0);
  queryTimeInForce((TimeInForce *)&local_1d0,(Application *)pFVar2);
  pFVar2 = &local_1d0;
  FIX50::NewOrderSingle::set(__return_storage_ptr__,(TimeInForce *)pFVar2);
  FIX::FieldBase::~FieldBase(&local_1d0);
  cVar1 = FIX::CharField::getValue((CharField *)&local_178);
  if (cVar1 == '2') {
LAB_0011bf8d:
    queryPrice((Price *)&local_1d0,(Application *)pFVar2);
    pFVar2 = &local_1d0;
    FIX50::NewOrderSingle::set(__return_storage_ptr__,(Price *)pFVar2);
    FIX::FieldBase::~FieldBase(&local_1d0);
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)&local_178);
    if (cVar1 == '4') goto LAB_0011bf8d;
  }
  cVar1 = FIX::CharField::getValue((CharField *)&local_178);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)&local_178);
    if (cVar1 != '4') goto LAB_0011bfeb;
  }
  queryStopPx((StopPx *)&local_1d0,(Application *)pFVar2);
  FIX50::NewOrderSingle::set(__return_storage_ptr__,(StopPx *)&local_1d0);
  FIX::FieldBase::~FieldBase(&local_1d0);
LAB_0011bfeb:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase(&local_178);
  return __return_storage_ptr__;
}

Assistant:

FIX50::NewOrderSingle Application::queryNewOrderSingle50() {
  FIX::OrdType ordType;

  FIX50::NewOrderSingle newOrderSingle(queryClOrdID(), querySide(), FIX::TransactTime(), ordType = queryOrdType());

  newOrderSingle.set(FIX::HandlInst('1'));
  newOrderSingle.set(querySymbol());
  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}